

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

Error __thiscall
asmjit::RALocalAllocator::allocJumpTable
          (RALocalAllocator *this,InstNode *node,RABlocks *targets,RABlock *cont)

{
  uint *puVar1;
  RABlock *block;
  void *pvVar2;
  long lVar3;
  long lVar4;
  PhysToWorkMap *pPVar5;
  int *piVar6;
  int *piVar7;
  byte bVar8;
  Error EVar9;
  uint32_t *puVar10;
  undefined8 extraout_RAX;
  BaseRAPass *pBVar11;
  BaseRAPass *siglen;
  uint uVar12;
  uint extraout_EDX;
  uchar *sig;
  uint uVar13;
  RALocalAllocator *this_00;
  int in_R8D;
  ulong uVar14;
  ulong uVar15;
  
  if ((targets->super_ZoneVectorBase)._size == 0) {
    return 3;
  }
  this_00 = (RALocalAllocator *)(node->super_BaseNode).field_0.field_0._prev;
  (this->_cc->super_BaseBuilder)._cursor = (BaseNode *)this_00;
  block = *(targets->super_ZoneVectorBase)._data;
  pBVar11 = (BaseRAPass *)(ulong)block->_sharedAssignmentId;
  if (pBVar11 == (BaseRAPass *)0xffffffff) {
    return 3;
  }
  if (block->_sharedAssignmentId < (this->_pass->_sharedAssignments).super_ZoneVectorBase._size) {
    pvVar2 = (this->_pass->_sharedAssignments).super_ZoneVectorBase._data;
    this_00 = this;
    EVar9 = allocInst(this,node);
    if (EVar9 != 0) {
      return EVar9;
    }
    node = *(InstNode **)((long)pvVar2 + (long)pBVar11 * 0x28 + 0x18);
    if (node != (InstNode *)0x0) {
      in_R8D = 1;
      this_00 = this;
      EVar9 = switchToAssignment(this,(PhysToWorkMap *)node,
                                 *(WorkToPhysMap **)((long)pvVar2 + (long)pBVar11 * 0x28 + 0x20),
                                 (ZoneBitVector *)((long)pvVar2 + (long)pBVar11 * 0x28 + 8),true,
                                 false);
      if (EVar9 != 0) {
        return EVar9;
      }
    }
    uVar12 = block->_sharedAssignmentId;
    if ((ulong)uVar12 == 0xffffffff) {
      puVar10 = &block->_entryScratchGpRegs;
LAB_0011ce44:
      EVar9 = spillScratchGpRegsBeforeEntry(this,*puVar10);
      if ((EVar9 == 0) &&
         ((*(long *)((long)pvVar2 + (long)pBVar11 * 0x28 + 0x18) != 0 ||
          (EVar9 = BaseRAPass::setBlockEntryAssignment
                             (this->_pass,block,this->_block,&this->_curAssignment), EVar9 == 0))))
      {
        EVar9 = 0;
      }
      return EVar9;
    }
    siglen = block->_ra;
    if (uVar12 < (siglen->_sharedAssignments).super_ZoneVectorBase._size) {
      puVar10 = (uint32_t *)
                ((ulong)uVar12 * 0x28 +
                (long)(siglen->_sharedAssignments).super_ZoneVectorBase._data);
      goto LAB_0011ce44;
    }
  }
  else {
    allocJumpTable();
    siglen = pBVar11;
  }
  allocJumpTable();
  uVar12 = (uint)sig;
  if (uVar12 == 0xffffffff) {
    RAAssignment::assign();
LAB_0011cf0c:
    RAAssignment::assign();
LAB_0011cf11:
    RAAssignment::assign();
LAB_0011cf16:
    RAAssignment::assign();
LAB_0011cf1b:
    RAAssignment::assign();
LAB_0011cf20:
    RAAssignment::assign();
LAB_0011cf25:
    RAAssignment::assign();
  }
  else {
    if (*(uint *)((long)&this_00->_cc + 4) <= uVar12) goto LAB_0011cf0c;
    lVar3 = *(long *)(this_00->_availableRegs)._masks;
    uVar14 = (ulong)sig & 0xffffffff;
    if (*(char *)(lVar3 + uVar14) != -1) goto LAB_0011cf11;
    if (0x1f < (uint)siglen) goto LAB_0011cf16;
    uVar15 = (ulong)node & 0xffffffff;
    if (*(int *)(*(long *)((this_00->_clobberedRegs)._masks + uVar15 * 2) +
                ((ulong)siglen & 0xffffffff) * 4) != -1) goto LAB_0011cf1b;
    if (3 < (uint)node) goto LAB_0011cf20;
    lVar4 = *(long *)((this_00->_availableRegs)._masks + 2);
    uVar13 = 1 << ((byte)siglen & 0x1f);
    node = (InstNode *)(ulong)uVar13;
    if ((*(uint *)(lVar4 + uVar15 * 4) >> ((uint)siglen & 0x1f) & 1) != 0) goto LAB_0011cf25;
    if ((*(uint *)(lVar4 + 0x10 + uVar15 * 4) & uVar13) == 0) {
      *(byte *)(lVar3 + uVar14) = (byte)siglen;
      *(uint *)(*(long *)((this_00->_clobberedRegs)._masks + uVar15 * 2) +
               ((ulong)siglen & 0xffffffff) * 4) = uVar12;
      lVar3 = *(long *)((this_00->_availableRegs)._masks + 2);
      puVar1 = (uint *)(lVar3 + uVar15 * 4);
      *puVar1 = *puVar1 | uVar13;
      puVar1 = (uint *)(lVar3 + 0x10 + uVar15 * 4);
      *puVar1 = *puVar1 | -in_R8D & uVar13;
      EVar9 = RAAssignment::verify
                        ((RAAssignment *)this_00,(EVP_PKEY_CTX *)node,sig,(size_t)siglen,
                         (uchar *)(ulong)(-in_R8D & uVar13),uVar14);
      return EVar9;
    }
  }
  uVar12 = (uint)siglen;
  RAAssignment::assign();
  if (extraout_EDX == 0xffffffff) {
    onSaveReg();
LAB_0011cf8b:
    onSaveReg();
LAB_0011cf90:
    onSaveReg();
LAB_0011cf95:
    onSaveReg();
  }
  else {
    if ((this_00->_curAssignment)._layout.workCount <= extraout_EDX) goto LAB_0011cf8b;
    if ((this_00->_curAssignment)._workToPhysMap[extraout_EDX].physIds[0] != uVar12)
    goto LAB_0011cf90;
    if (0x1f < uVar12) goto LAB_0011cf95;
    if ((this_00->_curAssignment)._physToWorkIds[(ulong)node & 0xffffffff][uVar12] == extraout_EDX)
    {
      if ((uint)node < 4) {
        bVar8 = (byte)uVar12 & 0x1f;
        pPVar5 = (this_00->_curAssignment)._physToWorkMap;
        puVar10 = (pPVar5->dirty)._masks + ((ulong)node & 0xffffffff);
        *puVar10 = *puVar10 & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
        EVar9 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xc])
                          (this_00->_pass,(ulong)extraout_EDX,(ulong)uVar12,extraout_RAX,pPVar5,
                           (ulong)uVar12,this);
        return EVar9;
      }
      goto LAB_0011cf9f;
    }
  }
  onSaveReg();
LAB_0011cf9f:
  onSaveReg();
  if ((((*(uint32_t *)&this_00->_pass == *(uint32_t *)&(node->super_BaseNode).field_0) &&
       (*(uint32_t *)((long)&this_00->_pass + 4) ==
        *(uint32_t *)((long)&(node->super_BaseNode).field_0 + 4))) &&
      (uVar12 = *(uint *)&this_00->_cc,
      uVar12 == *(uint32_t *)((long)&(node->super_BaseNode).field_0 + 8))) &&
     ((uVar13 = *(uint *)((long)&this_00->_cc + 4),
      uVar13 == *(uint32_t *)((long)&(node->super_BaseNode).field_0 + 0xc) &&
      (this_00->_archTraits == *(ArchTraits **)&(node->super_BaseNode).field_1)))) {
    if ((ulong)uVar12 != 0) {
      uVar14 = 0;
      do {
        if (*(int *)(*(long *)((this_00->_availableRegs)._masks + 2) + 0x20 + uVar14 * 4) !=
            *(int *)((long)(node->super_BaseNode)._passData + uVar14 * 4 + 0x20)) {
          return 0;
        }
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
    if ((ulong)uVar13 != 0) {
      uVar14 = 0;
      do {
        if (*(char *)(*(long *)(this_00->_availableRegs)._masks + uVar14) !=
            *(char *)((long)(node->super_BaseNode).field_3._userDataPtr + uVar14)) {
          return 0;
        }
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    piVar6 = *(int **)((this_00->_availableRegs)._masks + 2);
    piVar7 = (int *)(node->super_BaseNode)._passData;
    if (((*piVar6 == *piVar7) && (piVar6[1] == piVar7[1])) &&
       ((piVar6[2] == piVar7[2] &&
        ((((piVar6[3] == piVar7[3] && (piVar6[4] == piVar7[4])) && (piVar6[5] == piVar7[5])) &&
         ((piVar6[6] == piVar7[6] && (piVar6[7] == piVar7[7])))))))) {
      return (Error)CONCAT71((int7)((ulong)piVar6 >> 8),1);
    }
  }
  return 0;
}

Assistant:

Error RALocalAllocator::allocJumpTable(InstNode* node, const RABlocks& targets, RABlock* cont) noexcept {
  // TODO: Do we really need to use `cont`?
  DebugUtils::unused(cont);

  if (targets.empty())
    return DebugUtils::errored(kErrorInvalidState);

  // The cursor must point to the previous instruction for a possible instruction insertion.
  _cc->_setCursor(node->prev());

  // All `targets` should have the same sharedAssignmentId, we just read the first.
  RABlock* anyTarget = targets[0];
  if (!anyTarget->hasSharedAssignmentId())
    return DebugUtils::errored(kErrorInvalidState);

  RASharedAssignment& sharedAssignment = _pass->_sharedAssignments[anyTarget->sharedAssignmentId()];

  ASMJIT_PROPAGATE(allocInst(node));

  if (!sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(switchToAssignment(
      sharedAssignment.physToWorkMap(),
      sharedAssignment.workToPhysMap(),
      sharedAssignment.liveIn(),
      true,  // Read-only.
      false  // Try-mode.
    ));
  }

  ASMJIT_PROPAGATE(spillRegsBeforeEntry(anyTarget));

  if (sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(_pass->setBlockEntryAssignment(anyTarget, block(), _curAssignment));
  }

  return kErrorOk;
}